

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotateVector.h
# Opt level: O2

Vector3T<float> __thiscall
Gs::RotateVectorAroundAxis<float>(Gs *this,Vector3T<float> *vec,Vector3T<float> *axis,Real angle)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  float fVar6;
  Vector3T<float> VVar7;
  Vector<float,_3UL> local_50;
  Vector<float,_3UL> local_40;
  Vector<float,_3UL> local_30;
  
  Vector<float,_3UL>::Normalize(axis);
  fVar3 = sinf(angle);
  fVar4 = cosf(angle);
  fVar6 = 1.0 - fVar4;
  fVar5 = axis->z;
  uVar1 = axis->x;
  uVar2 = axis->y;
  local_30.y = fVar6 * (float)uVar1 * (float)uVar2 + -fVar3 * fVar5;
  local_30.x = (float)uVar1 * (float)uVar1 + (1.0 - (float)uVar1 * (float)uVar1) * fVar4;
  local_30.z = fVar5 * (float)uVar1 * fVar6 + fVar3 * (float)uVar2;
  local_40.y = (float)uVar2 * (float)uVar2 + (1.0 - (float)uVar2 * (float)uVar2) * fVar4;
  local_40.x = fVar6 * (float)uVar1 * (float)uVar2 + fVar5 * fVar3;
  local_40.z = fVar5 * (float)uVar2 * fVar6 - (float)uVar1 * fVar3;
  local_50.y = fVar6 * fVar5 * (float)uVar2 + (float)uVar1 * fVar3;
  local_50.x = fVar6 * fVar5 * (float)uVar1 + (float)uVar2 * -fVar3;
  local_50.z = (1.0 - fVar5 * fVar5) * fVar4 + fVar5 * fVar5;
  fVar5 = Dot<Gs::Vector<float,3ul>,float>(vec,&local_30);
  fVar3 = Dot<Gs::Vector<float,3ul>,float>(vec,&local_40);
  VVar7.x = Dot<Gs::Vector<float,3ul>,float>(vec,&local_50);
  *(float *)this = fVar5;
  *(float *)(this + 4) = fVar3;
  *(float *)(this + 8) = VVar7.x;
  VVar7.y = (float)extraout_XMM0_Db;
  VVar7.z = fVar3;
  return VVar7;
}

Assistant:

Vector3T<T> RotateVectorAroundAxis(const Vector3T<T>& vec, Vector3T<T> axis, Real angle)
{
    axis.Normalize();

    auto s       = std::sin(angle);
    auto c       = std::cos(angle);
    auto cInv    = Real(1) - c;

    Vector3T<T> row0, row1, row2;

    row0.x = axis.x*axis.x + c*(Real(1) - axis.x*axis.x);
    row0.y = axis.x*axis.y*cInv - s*axis.z;
    row0.z = axis.x*axis.z*cInv + s*axis.y;

    row1.x = axis.x*axis.y*cInv + s*axis.z;
    row1.y = axis.y*axis.y + c*(Real(1) - axis.y*axis.y);
    row1.z = axis.y*axis.z*cInv - s*axis.x;

    row2.x = axis.x*axis.z*cInv - s*axis.y;
    row2.y = axis.y*axis.z*cInv + s*axis.x;
    row2.z = axis.z*axis.z + c*(Real(1) - axis.z*axis.z);

    return Vector3T<T>(
        Dot(vec, row0),
        Dot(vec, row1),
        Dot(vec, row2)
    );
}